

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void AR30ToABGRRow_C(uint8_t *src_ar30,uint8_t *dst_abgr,int width)

{
  uint uVar1;
  long lVar2;
  
  if (0 < width) {
    lVar2 = 0;
    do {
      uVar1 = *(uint *)(src_ar30 + lVar2 * 4);
      *(uint *)(dst_abgr + lVar2 * 4) =
           (uVar1 >> 0x1e) * 0x55000000 |
           (uVar1 & 0x3fc) << 0xe | uVar1 >> 4 & 0xff00 | uVar1 >> 0x16 & 0xff;
      lVar2 = lVar2 + 1;
    } while (width != (int)lVar2);
  }
  return;
}

Assistant:

void AR30ToABGRRow_C(const uint8_t* src_ar30, uint8_t* dst_abgr, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint32_t ar30;
    memcpy(&ar30, src_ar30, sizeof ar30);
    uint32_t b = (ar30 >> 2) & 0xff;
    uint32_t g = (ar30 >> 12) & 0xff;
    uint32_t r = (ar30 >> 22) & 0xff;
    uint32_t a = (ar30 >> 30) * 0x55;  // Replicate 2 bits to 8 bits.
    *(uint32_t*)(dst_abgr) = r | (g << 8) | (b << 16) | (a << 24);
    dst_abgr += 4;
    src_ar30 += 4;
  }
}